

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeDeviceReleaseExternalSemaphoreExtPrologue
          (ZEHandleLifetimeValidation *this,ze_external_semaphore_ext_handle_t hSemaphore)

{
  bool bVar1;
  pointer this_00;
  ze_external_semaphore_ext_handle_t hSemaphore_local;
  ZEHandleLifetimeValidation *this_local;
  
  this_00 = std::
            unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
            ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                          *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid<_ze_external_semaphore_ext_handle_t*>
                    (this_00,hSemaphore);
  if (bVar1) {
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeDeviceReleaseExternalSemaphoreExtPrologue(
        ze_external_semaphore_ext_handle_t hSemaphore   ///< [in] The handle of the external semaphore.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hSemaphore )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }